

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::DBConstructor::NewDB(DBConstructor *this)

{
  Status SVar1;
  int line;
  char *in_R9;
  Status status;
  AssertHelper local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertionResult gtest_ar_;
  string local_e8;
  string name;
  string local_a8;
  Options options;
  
  testing::TempDir_abi_cxx11_();
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options
                 ,"table_testdb");
  std::__cxx11::string::_M_dispose();
  Options::Options(&options);
  options.comparator = this->comparator_;
  DestroyDB((leveldb *)&status,&name,&options);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = status.state_ == (char *)0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    options.create_if_missing = true;
    options.error_if_exists = true;
    options.write_buffer_size = 10000;
    DB::Open((DB *)&local_e8,&options,&name,&this->db_);
    SVar1 = status;
    status.state_ = local_e8._M_dataplus._M_p;
    local_e8._M_dataplus._M_p = SVar1.state_;
    Status::~Status((Status *)&local_e8);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = status.state_ == (char *)0x0;
    if (gtest_ar_.success_) goto LAB_0010fe97;
    testing::Message::Message((Message *)&local_100);
    Status::ToString_abi_cxx11_(&local_e8,&status);
    std::operator<<((ostream *)(local_100._M_head_impl + 0x10),(string *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"status.ok()","false","true",
               in_R9);
    line = 0x16e;
  }
  else {
    testing::Message::Message((Message *)&local_100);
    Status::ToString_abi_cxx11_(&local_e8,&status);
    std::operator<<((ostream *)(local_100._M_head_impl + 0x10),(string *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"status.ok()","false","true",
               in_R9);
    line = 0x168;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_test.cc"
             ,line,local_a8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
  testing::internal::AssertHelper::~AssertHelper(&local_108);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (local_100._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_100._M_head_impl + 8))();
  }
LAB_0010fe97:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  Status::~Status(&status);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void NewDB() {
    std::string name = testing::TempDir() + "table_testdb";

    Options options;
    options.comparator = comparator_;
    Status status = DestroyDB(name, options);
    ASSERT_TRUE(status.ok()) << status.ToString();

    options.create_if_missing = true;
    options.error_if_exists = true;
    options.write_buffer_size = 10000;  // Something small to force merging
    status = DB::Open(options, name, &db_);
    ASSERT_TRUE(status.ok()) << status.ToString();
  }